

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_global_escape(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  JSValueUnion JVar4;
  void *pvVar5;
  JSRefCountHeader *p;
  uint c;
  ulong uVar6;
  JSValue JVar7;
  StringBuffer b_s;
  StringBuffer local_60;
  JSContext *local_40;
  int64_t local_38;
  
  JVar7 = JS_ToStringInternal(ctx,*argv,0);
  local_38 = JVar7.tag;
  JVar4 = JVar7.u;
  if ((int)JVar7.tag != 6) {
    local_60.size = *(uint *)((long)JVar4.ptr + 4) & 0x7fffffff;
    local_60.len = 0;
    local_60.is_wide_char = 0;
    local_60.error_status = 0;
    local_60.ctx = ctx;
    local_40 = ctx;
    local_60.str = js_alloc_string(ctx,local_60.size,0);
    if (local_60.str == (JSString *)0x0) {
      local_60.size = 0;
      local_60.error_status = -1;
    }
    uVar3 = *(ulong *)((long)JVar4.ptr + 4);
    if ((uVar3 & 0x7fffffff) != 0) {
      uVar6 = 0;
      do {
        if ((*(byte *)((long)JVar4.ptr + 7) & 0x80) == 0) {
          c = (uint)*(byte *)((long)JVar4.ptr + uVar6 + 0x10);
LAB_00165a58:
          pvVar5 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789@*_+-./",c,
                          0x45);
          if (pvVar5 == (void *)0x0) goto LAB_00165a78;
          string_buffer_putc16(&local_60,c);
        }
        else {
          uVar1 = *(ushort *)((long)JVar4.ptr + uVar6 * 2 + 0x10);
          c = (uint)uVar1;
          if (uVar1 < 0x100) goto LAB_00165a58;
LAB_00165a78:
          encodeURI_hex(&local_60,c);
        }
        uVar6 = uVar6 + 1;
      } while (((uint)uVar3 & 0x7fffffff) != uVar6);
    }
    if ((0xfffffff4 < (uint)local_38) &&
       (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
      JVar7.tag = local_38;
      JVar7.u.ptr = JVar4.ptr;
      __JS_FreeValueRT(local_40->rt,JVar7);
    }
    JVar7 = string_buffer_end(&local_60);
  }
  return JVar7;
}

Assistant:

static JSValue js_global_escape(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int i, len, c;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (i = 0, len = p->len; i < len; i++) {
        c = string_get(p, i);
        if (isUnescaped(c)) {
            string_buffer_putc16(b, c);
        } else {
            encodeURI_hex(b, c);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);
}